

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZnode.h
# Opt level: O2

void __thiscall
chrono::ChLoadXYZnodeXYZnodeBushing::~ChLoadXYZnodeXYZnodeBushing(ChLoadXYZnodeXYZnodeBushing *this)

{
  ~ChLoadXYZnodeXYZnodeBushing(this);
  ::operator_delete(this,0xd0);
  return;
}

Assistant:

class ChApi ChLoadXYZnodeXYZnodeBushing : public ChLoadXYZnodeXYZnode {
  public:
    ChLoadXYZnodeXYZnodeBushing(std::shared_ptr<ChNodeXYZ> mnodeA,  ///< node to apply load to
                                std::shared_ptr<ChNodeXYZ> mnodeB   ///< node to apply load to as reaction
    );

    /// "Virtual" copy constructor (covariant return type).
    virtual ChLoadXYZnodeXYZnodeBushing* Clone() const override { return new ChLoadXYZnodeXYZnodeBushing(*this); }

	/// Compute the force on the nodeA, in absolute coordsystem,
    /// given relative position of nodeA respect to B, in absolute basis
    virtual void ComputeForce(const ChVector<>& rel_pos,
									 const ChVector<>& rel_vel,
                                           ChVector<>& abs_force) override;
	
	/// Set force as a function of displacement on X. Default was constant zero. 
	void SetFunctionForceX(std::shared_ptr<ChFunction> fx) { force_dX = fx; }

	/// Set force as a function of displacement on X. Default was constant zero. 
	void SetFunctionForceY(std::shared_ptr<ChFunction> fy) { force_dY = fy; }
	
	/// Set force as a function of displacement on X. Default was constant zero. 
	void SetFunctionForceZ(std::shared_ptr<ChFunction> fz) { force_dZ = fz; }

	/// Set xyz constant damping coefficients [Ns/m] 
	/// along the three absolute directions xyz
    void SetDamping(const ChVector<> mdamping) { R = mdamping; }
    ChVector<> GetDamping() const { return R; }

	/// Use this to enable the stiff force computation (i.e. it enables the
	/// automated computation of the jacobian by numerical differentiation to 
	/// elp the convergence of implicit integrators, but adding CPU overhead).
	void SetStiff(bool ms) { this->is_stiff = ms; }

  protected:
	  std::shared_ptr<ChFunction> force_dX;
	  std::shared_ptr<ChFunction> force_dY;
	  std::shared_ptr<ChFunction> force_dZ;

	  ChVector<> R;

	  bool is_stiff;

	  virtual bool IsStiff() override { return is_stiff; }
}